

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

int __thiscall
Fl_Help_View::do_align(Fl_Help_View *this,Fl_Help_Block *block,int line,int xx,int a,int *l)

{
  int *piVar1;
  Fl_Help_Link *pFVar2;
  int iVar3;
  int iVar4;
  
  if (a == 0) {
    iVar3 = (block->w - xx) / 2;
  }
  else {
    iVar3 = 0;
    if (a == -1) {
      iVar3 = block->w - xx;
    }
  }
  block->line[line] = block->x + iVar3;
  iVar4 = *l;
  if (iVar4 < this->nlinks_) {
    pFVar2 = this->links_;
    do {
      piVar1 = &pFVar2[iVar4].x;
      *piVar1 = *piVar1 + iVar3;
      piVar1 = &pFVar2[*l].w;
      *piVar1 = *piVar1 + iVar3;
      iVar4 = *l + 1;
      *l = iVar4;
    } while (iVar4 < this->nlinks_);
  }
  return (uint)(line < 0x1f) + line;
}

Assistant:

int						// O - New line
Fl_Help_View::do_align(Fl_Help_Block *block,	// I - Block to add to
                      int          line,	// I - Current line
		      int          xx,		// I - Current X position
		      int          a,		// I - Current alignment
		      int          &l)		// IO - Starting link
{
  int	offset;					// Alignment offset


  switch (a)
  {
    case RIGHT :	// Right align
	offset = block->w - xx;
	break;
    case CENTER :	// Center
	offset = (block->w - xx) / 2;
	break;
    default :		// Left align
	offset = 0;
	break;
  }

  block->line[line] = block->x + offset;

  if (line < 31)
    line ++;

  while (l < nlinks_)
  {
    links_[l].x += offset;
    links_[l].w += offset;
    l ++;
  }

  return (line);
}